

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_comp_avg_upsampled_pred_c
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,int subpel_search)

{
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int j;
  int i;
  uint8_t *in_stack_00009160;
  MV *in_stack_00009168;
  int in_stack_00009170;
  int in_stack_00009174;
  AV1_COMMON *in_stack_00009178;
  MACROBLOCKD *in_stack_00009180;
  int in_stack_000091b0;
  int in_stack_000091b8;
  int in_stack_000091c0;
  int in_stack_000091c8;
  uint8_t *in_stack_000091d0;
  int in_stack_000091d8;
  int in_stack_000091e0;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  
  aom_upsampled_pred_c
            (in_stack_00009180,in_stack_00009178,in_stack_00009174,in_stack_00009170,
             in_stack_00009168,in_stack_00009160,in_stack_000091b0,in_stack_000091b8,
             in_stack_000091c0,in_stack_000091c8,in_stack_000091d0,in_stack_000091d8,
             in_stack_000091e0);
  local_48 = in_R9;
  for (local_4c = 0; local_4c < in_stack_00000018; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < in_stack_00000010; local_50 = local_50 + 1) {
      *(char *)(local_48 + local_50) =
           (char)((int)((uint)*(byte *)(local_48 + local_50) +
                        (uint)*(byte *)(in_stack_00000008 + local_50) + 1) >> 1);
    }
    local_48 = local_48 + in_stack_00000010;
    in_stack_00000008 = in_stack_00000008 + in_stack_00000010;
  }
  return;
}

Assistant:

void aom_comp_avg_upsampled_pred_c(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                   int mi_row, int mi_col, const MV *const mv,
                                   uint8_t *comp_pred, const uint8_t *pred,
                                   int width, int height, int subpel_x_q3,
                                   int subpel_y_q3, const uint8_t *ref,
                                   int ref_stride, int subpel_search) {
  int i, j;

  aom_upsampled_pred_c(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                       subpel_x_q3, subpel_y_q3, ref, ref_stride,
                       subpel_search);
  for (i = 0; i < height; i++) {
    for (j = 0; j < width; j++) {
      comp_pred[j] = ROUND_POWER_OF_TWO(comp_pred[j] + pred[j], 1);
    }
    comp_pred += width;
    pred += width;
  }
}